

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtableview.cpp
# Opt level: O3

void QTableView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  QHeaderView *pQVar5;
  
  if (_c == WriteProperty) {
    if (4 < (uint)_id) {
      return;
    }
    piVar1 = (int *)*_a;
    switch(_id) {
    case 1:
      lVar3 = *(long *)(_o + 8);
      if (*(int *)(lVar3 + 0x544) == *piVar1) {
        return;
      }
      *(int *)(lVar3 + 0x544) = *piVar1;
      goto LAB_0058cdeb;
    case 2:
      setSortingEnabled((QTableView *)_o,SUB41(*piVar1,0));
      return;
    case 3:
      setWordWrap((QTableView *)_o,SUB41(*piVar1,0));
      return;
    case 4:
      QWidget::setEnabled(*(QWidget **)(*(long *)(_o + 8) + 0x590),SUB41(*piVar1,0));
      return;
    }
switchD_0058cd39_caseD_0:
    lVar3 = *(long *)(_o + 8);
    if (*(char *)(lVar3 + 0x540) != (char)*piVar1) {
      *(char *)(lVar3 + 0x540) = (char)*piVar1;
LAB_0058cdeb:
      QWidget::update(*(QWidget **)(lVar3 + 0x2b0));
      return;
    }
switchD_0058ccdf_default:
    return;
  }
  if (_c == ReadProperty) {
    if (4 < (uint)_id) {
      return;
    }
    switch(_id) {
    case 0:
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x540);
      break;
    case 1:
      *(undefined4 *)*_a = *(undefined4 *)(*(long *)(_o + 8) + 0x544);
      return;
    case 2:
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x640);
      break;
    case 3:
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x491);
      break;
    case 4:
      bVar2 = ~*(byte *)(*(long *)(*(long *)(*(long *)(_o + 8) + 0x590) + 0x20) + 8) & 1;
    }
    *(byte *)*_a = bVar2;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    QTableViewPrivate::selectRow(*(QTableViewPrivate **)(_o + 8),*_a[1],true);
    return;
  case 1:
    QTableViewPrivate::selectColumn(*(QTableViewPrivate **)(_o + 8),*_a[1],true);
    return;
  case 2:
    iVar4 = *_a[1];
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x588);
    break;
  case 3:
    iVar4 = *_a[1];
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x580);
    break;
  case 4:
    iVar4 = *_a[1];
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x588);
    goto LAB_0058cea3;
  case 5:
    iVar4 = *_a[1];
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x580);
LAB_0058cea3:
    QHeaderView::setSectionHidden(pQVar5,iVar4,false);
    return;
  case 6:
    resizeRowToContents((QTableView *)_o,*_a[1]);
    return;
  case 7:
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x588);
    goto LAB_0058ce6f;
  case 8:
    resizeColumnToContents((QTableView *)_o,*_a[1]);
    return;
  case 9:
    pQVar5 = *(QHeaderView **)(*(long *)(_o + 8) + 0x580);
LAB_0058ce6f:
    QHeaderView::resizeSections(pQVar5,ResizeToContents);
    return;
  case 10:
    sortByColumn((QTableView *)_o,*_a[1],*_a[2]);
    return;
  case 0xb:
    piVar1 = (int *)_a[1];
    goto switchD_0058cd39_caseD_0;
  case 0xc:
    rowMoved((QTableView *)_o,0,*_a[2],*_a[3]);
    return;
  case 0xd:
    columnMoved((QTableView *)_o,0,*_a[2],*_a[3]);
    return;
  case 0xe:
    rowResized((QTableView *)_o,*_a[1],0x6ee8c4,(int)_a);
    return;
  case 0xf:
    columnResized((QTableView *)_o,*_a[1],0x6ee8c4,(int)_a);
    return;
  case 0x10:
    rowCountChanged((QTableView *)_o,*_a[1],*_a[2]);
    return;
  case 0x11:
    FUN_0029a670();
    return;
  default:
    goto switchD_0058ccdf_default;
  }
  QHeaderView::setSectionHidden(pQVar5,iVar4,true);
  return;
}

Assistant:

void QTableView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->selectColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->hideRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->showRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->resizeRowToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->resizeRowsToContents(); break;
        case 8: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->resizeColumnsToContents(); break;
        case 10: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 11: _t->setShowGrid((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->rowMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->columnMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->rowResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 15: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 16: _t->rowCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 17: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->showGrid(); break;
        case 1: *reinterpret_cast<Qt::PenStyle*>(_v) = _t->gridStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCornerButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShowGrid(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setGridStyle(*reinterpret_cast<Qt::PenStyle*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setCornerButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}